

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Refract<1>::doExpand
          (Refract<1> *this,ExpandContext *ctx,ArgExprs *args)

{
  ExprP<float> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  double __x;
  ExprP<float> EVar1;
  ExprP<float> local_360;
  ExprP<float> local_350;
  ExprP<float> local_340;
  ExprP<float> local_330;
  ExprP<float> local_320;
  ExprP<float> local_310;
  float local_2fc;
  ExprP<float> local_2f8;
  ExprP<float> local_2e8;
  float local_2d4;
  ExprP<float> local_2d0;
  ExprP<bool> local_2c0;
  ExprP<float> local_2b0;
  allocator<char> local_299;
  string local_298;
  VariableP<float> local_278;
  undefined1 local_268 [8];
  ExprP<float> k;
  ExprP<float> local_250;
  ExprP<float> local_240;
  float local_22c;
  ExprP<float> local_228;
  ExprP<float> local_218;
  ExprP<float> local_208;
  ExprP<float> local_1f8;
  ExprP<float> local_1e8;
  ExprP<float> local_1d8;
  ExprP<float> local_1c8;
  allocator<char> local_1b1;
  string local_1b0;
  VariableP<float> local_190;
  undefined1 local_180 [8];
  ExprP<float> k2;
  float local_15c;
  ExprP<float> local_158;
  ExprP<float> local_148;
  ExprP<float> local_138;
  ExprP<float> local_128;
  float local_114;
  ExprP<float> local_110;
  ExprP<float> local_100;
  allocator<char> local_e9;
  string local_e8;
  VariableP<float> local_c8;
  undefined1 local_b8 [8];
  ExprP<float> k1;
  allocator<char> local_81;
  string local_80;
  VariableP<float> local_60;
  undefined1 local_50 [8];
  ExprP<float> dotNI;
  ExprP<float> *eta;
  ExprP<float> *n;
  ExprP<float> *i;
  ArgExprs *args_local;
  ExpandContext *ctx_local;
  Refract<1> *this_local;
  
  dotNI.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = (SharedPtrStateBase *)(in_RCX + 2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"dotNI",&local_81);
  dot((Functions *)
      &k1.super_ExprPBase<float>.
       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state,in_RCX + 1,
      in_RCX);
  bindExpression<float>
            ((BuiltinPrecisionTests *)&local_60,&local_80,(ExpandContext *)args,
             (ExprP<float> *)
             &k1.super_ExprPBase<float>.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)local_50);
  VariableP<float>::~VariableP(&local_60);
  ExprP<float>::~ExprP
            ((ExprP<float> *)
             &k1.super_ExprPBase<float>.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"k1",&local_e9);
  local_114 = 1.0;
  constant<float>((BuiltinPrecisionTests *)&local_110,&local_114);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_138,
             (ExprP<float> *)
             dotNI.super_ExprPBase<float>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state,
             (ExprP<float> *)
             dotNI.super_ExprPBase<float>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state);
  local_15c = 1.0;
  constant<float>((BuiltinPrecisionTests *)&local_158,&local_15c);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)
             &k2.super_ExprPBase<float>.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state,
             (ExprP<float> *)local_50,(ExprP<float> *)local_50);
  BuiltinPrecisionTests::operator-
            ((BuiltinPrecisionTests *)&local_148,&local_158,
             (ExprP<float> *)
             &k2.super_ExprPBase<float>.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_128,&local_138,&local_148);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_100,&local_110,&local_128);
  bindExpression<float>
            ((BuiltinPrecisionTests *)&local_c8,&local_e8,(ExpandContext *)args,&local_100);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)local_b8);
  VariableP<float>::~VariableP(&local_c8);
  ExprP<float>::~ExprP(&local_100);
  ExprP<float>::~ExprP(&local_128);
  ExprP<float>::~ExprP(&local_148);
  ExprP<float>::~ExprP
            ((ExprP<float> *)
             &k2.super_ExprPBase<float>.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state);
  ExprP<float>::~ExprP(&local_158);
  ExprP<float>::~ExprP(&local_138);
  ExprP<float>::~ExprP(&local_110);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"k2",&local_1b1);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_218,(ExprP<float> *)local_50);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_208,(ExprP<float> *)local_50,&local_218);
  local_22c = 1.0;
  constant<float>((BuiltinPrecisionTests *)&local_228,&local_22c);
  BuiltinPrecisionTests::operator+((BuiltinPrecisionTests *)&local_1f8,&local_208,&local_228);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_1e8,&local_1f8,
             (ExprP<float> *)
             dotNI.super_ExprPBase<float>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state);
  BuiltinPrecisionTests::operator-
            ((BuiltinPrecisionTests *)&local_240,
             (ExprP<float> *)
             dotNI.super_ExprPBase<float>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_1d8,&local_1e8,&local_240);
  k.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.
  m_state._4_4_ = 0x3f800000;
  constant<float>((BuiltinPrecisionTests *)&local_250,
                  (float *)((long)&k.super_ExprPBase<float>.
                                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
                                   .m_state + 4));
  BuiltinPrecisionTests::operator+((BuiltinPrecisionTests *)&local_1c8,&local_1d8,&local_250);
  bindExpression<float>
            ((BuiltinPrecisionTests *)&local_190,&local_1b0,(ExpandContext *)args,&local_1c8);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)local_180);
  VariableP<float>::~VariableP(&local_190);
  ExprP<float>::~ExprP(&local_1c8);
  ExprP<float>::~ExprP(&local_250);
  ExprP<float>::~ExprP(&local_1d8);
  ExprP<float>::~ExprP(&local_240);
  ExprP<float>::~ExprP(&local_1e8);
  ExprP<float>::~ExprP(&local_1f8);
  ExprP<float>::~ExprP(&local_228);
  ExprP<float>::~ExprP(&local_208);
  ExprP<float>::~ExprP(&local_218);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"k",&local_299);
  alternatives<float>((BuiltinPrecisionTests *)&local_2b0,(ExprP<float> *)local_b8,
                      (ExprP<float> *)local_180);
  bindExpression<float>
            ((BuiltinPrecisionTests *)&local_278,&local_298,(ExpandContext *)args,&local_2b0);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)local_268);
  VariableP<float>::~VariableP(&local_278);
  ExprP<float>::~ExprP(&local_2b0);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  local_2d4 = 0.0;
  constant<float>((BuiltinPrecisionTests *)&local_2d0,&local_2d4);
  BuiltinPrecisionTests::operator<
            ((BuiltinPrecisionTests *)&local_2c0,(ExprP<float> *)local_268,&local_2d0);
  local_2fc = 0.0;
  constant<float>((BuiltinPrecisionTests *)&local_2f8,&local_2fc);
  genXType<float,1>((Functions *)&local_2e8,&local_2f8);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_320,in_RCX,
             (ExprP<float> *)
             dotNI.super_ExprPBase<float>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_350,
             (ExprP<float> *)
             dotNI.super_ExprPBase<float>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state,
             (ExprP<float> *)local_50);
  sqrt((Functions *)&local_360,__x);
  BuiltinPrecisionTests::operator+((BuiltinPrecisionTests *)&local_340,&local_350,&local_360);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_330,in_RCX + 1,&local_340);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_310,&local_320,&local_330);
  cond<float>((BuiltinPrecisionTests *)this,&local_2c0,&local_2e8,&local_310);
  ExprP<float>::~ExprP(&local_310);
  ExprP<float>::~ExprP(&local_330);
  ExprP<float>::~ExprP(&local_340);
  ExprP<float>::~ExprP(&local_360);
  ExprP<float>::~ExprP(&local_350);
  ExprP<float>::~ExprP(&local_320);
  ExprP<float>::~ExprP(&local_2e8);
  ExprP<float>::~ExprP(&local_2f8);
  ExprP<bool>::~ExprP(&local_2c0);
  ExprP<float>::~ExprP(&local_2d0);
  ExprP<float>::~ExprP((ExprP<float> *)local_268);
  ExprP<float>::~ExprP((ExprP<float> *)local_180);
  ExprP<float>::~ExprP((ExprP<float> *)local_b8);
  ExprP<float>::~ExprP((ExprP<float> *)local_50);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&	ctx, const ArgExprs& args) const
	{
		const ExprP<Arg0>&	i		= args.a;
		const ExprP<Arg1>&	n		= args.b;
		const ExprP<float>&	eta		= args.c;
		const ExprP<float>	dotNI	= bindExpression("dotNI", ctx, dot(n, i));
		const ExprP<float>	k1		= bindExpression("k1", ctx, constant(1.0f) - eta * eta *
												(constant(1.0f) - dotNI * dotNI));

		const ExprP<float>	k2		= bindExpression("k2", ctx,
												(((dotNI * (-dotNI)) + constant(1.0f)) * eta)
												* (-eta) + constant(1.0f));
		const ExprP<float>	k		= bindExpression("k", ctx, alternatives(k1, k2));

		return cond(k < constant(0.0f),
					genXType<float, Size>(constant(0.0f)),
					i * eta - n * (eta * dotNI + sqrt(k)));
	}